

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MultipleConcatenationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MultipleConcatenationExpressionSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::syntax::ConcatenationExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,
          ConcatenationExpressionSyntax *args_2,Token *args_3)

{
  Token openBrace;
  Token closeBrace;
  MultipleConcatenationExpressionSyntax *this_00;
  Token *args_local_3;
  ConcatenationExpressionSyntax *args_local_2;
  ExpressionSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (MultipleConcatenationExpressionSyntax *)allocate(this,0x40,8);
  openBrace.kind = args->kind;
  openBrace._2_1_ = args->field_0x2;
  openBrace.numFlags.raw = (args->numFlags).raw;
  openBrace.rawLen = args->rawLen;
  openBrace.info = args->info;
  closeBrace.kind = args_3->kind;
  closeBrace._2_1_ = args_3->field_0x2;
  closeBrace.numFlags.raw = (args_3->numFlags).raw;
  closeBrace.rawLen = args_3->rawLen;
  closeBrace.info = args_3->info;
  slang::syntax::MultipleConcatenationExpressionSyntax::MultipleConcatenationExpressionSyntax
            (this_00,openBrace,args_1,args_2,closeBrace);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }